

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O1

void re_goto_bottom(EditLine *el)

{
  wint_t **ppwVar1;
  long lVar2;
  
  terminal_move_to_line(el,(el->el_refresh).r_oldcv);
  terminal__putc(el,10);
  (el->el_cursor).h = L'\0';
  (el->el_cursor).v = L'\0';
  if (L'\0' < (el->el_terminal).t_size.v) {
    ppwVar1 = el->el_display;
    lVar2 = 0;
    do {
      *ppwVar1[lVar2] = 0;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (el->el_terminal).t_size.v);
  }
  (el->el_refresh).r_oldcv = L'\0';
  terminal__flush(el);
  return;
}

Assistant:

libedit_private void
re_goto_bottom(EditLine *el)
{

	terminal_move_to_line(el, el->el_refresh.r_oldcv);
	terminal__putc(el, '\n');
	re_clear_display(el);
	terminal__flush(el);
}